

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O3

void __thiscall glslang::TSymbolTable::copyTable(TSymbolTable *this,TSymbolTable *copyOf)

{
  int iVar1;
  TSymbolTableLevel *in_RAX;
  void *pvVar2;
  undefined4 extraout_var;
  pointer ppTVar3;
  void *__child_stack;
  uint uVar4;
  TSymbolTable *__fn;
  void *in_R8;
  TSymbolTableLevel *local_28;
  
  uVar4 = this->adoptedLevels;
  pvVar2 = (void *)(ulong)uVar4;
  if (uVar4 != copyOf->adoptedLevels) {
    __assert_fail("adoptedLevels == copyOf.adoptedLevels",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.cpp"
                  ,0x1eb,"void glslang::TSymbolTable::copyTable(const TSymbolTable &)");
  }
  this->uniqueId = copyOf->uniqueId;
  this->noBuiltInRedeclarations = copyOf->noBuiltInRedeclarations;
  this->separateNameSpaces = copyOf->separateNameSpaces;
  ppTVar3 = (copyOf->table).
            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __child_stack =
       (void *)((long)(copyOf->table).
                      super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3);
  __fn = copyOf;
  local_28 = in_RAX;
  if (pvVar2 < __child_stack) {
    do {
      uVar4 = uVar4 + 1;
      iVar1 = TSymbolTableLevel::clone
                        (ppTVar3[(long)pvVar2],(__fn *)__fn,__child_stack,(int)ppTVar3,in_R8);
      local_28 = (TSymbolTableLevel *)CONCAT44(extraout_var,iVar1);
      __fn = (TSymbolTable *)&local_28;
      std::vector<glslang::TSymbolTableLevel*,std::allocator<glslang::TSymbolTableLevel*>>::
      emplace_back<glslang::TSymbolTableLevel*>
                ((vector<glslang::TSymbolTableLevel*,std::allocator<glslang::TSymbolTableLevel*>> *)
                 this,&local_28);
      pvVar2 = (void *)(ulong)uVar4;
      ppTVar3 = (copyOf->table).
                super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __child_stack =
           (void *)((long)(copyOf->table).
                          super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3);
    } while (pvVar2 < __child_stack);
  }
  return;
}

Assistant:

void TSymbolTable::copyTable(const TSymbolTable& copyOf)
{
    assert(adoptedLevels == copyOf.adoptedLevels);

    uniqueId = copyOf.uniqueId;
    noBuiltInRedeclarations = copyOf.noBuiltInRedeclarations;
    separateNameSpaces = copyOf.separateNameSpaces;
    for (unsigned int i = copyOf.adoptedLevels; i < copyOf.table.size(); ++i)
        table.push_back(copyOf.table[i]->clone());
}